

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libpopcnt.h
# Opt level: O0

int get_cpuid(void)

{
  uint uVar1;
  int xcr0;
  int zmm_mask;
  int ymm_mask;
  int osxsave_mask;
  int abcd [4];
  uint local_10;
  uint local_c;
  int flags;
  
  local_10 = 0;
  run_cpuid(1,0,&ymm_mask);
  if ((abcd[0] & 0x800000U) == 0x800000) {
    local_10 = 0x800000;
  }
  if ((abcd[0] & 0x8000000U) == 0x8000000) {
    uVar1 = get_xcr0();
    if ((uVar1 & 6) == 6) {
      run_cpuid(7,0,&ymm_mask);
      if ((osxsave_mask & 0x20U) == 0x20) {
        local_10 = local_10 | 0x20;
      }
      if (((uVar1 & 0xe6) == 0xe6) && ((osxsave_mask & 0x40000000U) == 0x40000000)) {
        local_10 = local_10 | 0x40000000;
      }
    }
    local_c = local_10;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static inline int get_cpuid()
{
  int flags = 0;
  int abcd[4];

  run_cpuid(1, 0, abcd);

  if ((abcd[2] & bit_POPCNT) == bit_POPCNT)
    flags |= bit_POPCNT;

#if defined(HAVE_AVX2) || \
    defined(HAVE_AVX512)

  int osxsave_mask = (1 << 27);

  /* ensure OS supports extended processor state management */
  if ((abcd[2] & osxsave_mask) != osxsave_mask)
    return 0;

  int ymm_mask = XSTATE_SSE | XSTATE_YMM;
  int zmm_mask = XSTATE_SSE | XSTATE_YMM | XSTATE_ZMM;

  int xcr0 = get_xcr0();

  if ((xcr0 & ymm_mask) == ymm_mask)
  {
    run_cpuid(7, 0, abcd);

    if ((abcd[1] & bit_AVX2) == bit_AVX2)
      flags |= bit_AVX2;

    if ((xcr0 & zmm_mask) == zmm_mask)
    {
      if ((abcd[1] & bit_AVX512) == bit_AVX512)
        flags |= bit_AVX512;
    }
  }

#endif

  return flags;
}